

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1502.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char *pcVar11;
  timeval tVar12;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  char redirect [160];
  int local_270;
  int local_26c;
  timeval local_268;
  fd_set local_258;
  fd_set local_1d8;
  fd_set local_158;
  undefined1 local_d8 [168];
  
  curl_msnprintf(local_d8,0xa0,"google.com:%s:%s",libtest_arg2,libtest_arg3);
  tv_test_start = tutil_tvnow();
  lVar3 = curl_slist_append(0,local_d8);
  if (lVar3 == 0) {
    curl_mfprintf(_stderr,"curl_slist_append() failed\n");
    iVar1 = 0x7e;
    goto LAB_0010248b;
  }
  iVar1 = curl_global_init(3);
  uVar10 = _stderr;
  if (iVar1 == 0) {
    lVar5 = curl_easy_init();
    if (lVar5 == 0) {
      lVar6 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1502.c"
                    ,0x47);
      iVar1 = 0x7c;
      goto LAB_0010246e;
    }
    iVar1 = curl_easy_setopt(lVar5,0x2712,URL);
    uVar10 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar5,0x2a,1);
      uVar10 = _stderr;
      if (iVar1 != 0) {
        uVar4 = curl_easy_strerror(iVar1);
        pcVar11 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar6 = 0;
        uVar9 = 0x4a;
        goto LAB_00102461;
      }
      iVar1 = curl_easy_setopt(lVar5,0x27db,lVar3);
      uVar10 = _stderr;
      if (iVar1 != 0) {
        uVar4 = curl_easy_strerror(iVar1);
        pcVar11 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar6 = 0;
        uVar9 = 0x4b;
        goto LAB_00102461;
      }
      lVar6 = curl_multi_init();
      if (lVar6 != 0) {
        iVar1 = curl_multi_add_handle(lVar6,lVar5);
        uVar10 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_multi_perform(lVar6,&local_270);
          uVar10 = _stderr;
          if (iVar1 == 0) {
            if (local_270 < 0) {
              pcVar11 = 
              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
              ;
              uVar10 = 0x51;
LAB_0010277d:
              curl_mfprintf(_stderr,pcVar11,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1502.c"
                            ,uVar10);
              iVar1 = 0x7a;
            }
            else {
              tVar12 = tutil_tvnow();
              lVar7 = tutil_tvdiff(tVar12,tv_test_start);
              if (lVar7 < 0xea61) {
                iVar1 = 0;
                do {
                  if (local_270 == 0) goto LAB_0010246e;
                  local_26c = -99;
                  local_158.__fds_bits[0] = 0;
                  local_158.__fds_bits[1] = 0;
                  local_158.__fds_bits[2] = 0;
                  local_158.__fds_bits[3] = 0;
                  local_158.__fds_bits[4] = 0;
                  local_158.__fds_bits[5] = 0;
                  local_158.__fds_bits[6] = 0;
                  local_158.__fds_bits[7] = 0;
                  local_158.__fds_bits[8] = 0;
                  local_158.__fds_bits[9] = 0;
                  local_158.__fds_bits[10] = 0;
                  local_158.__fds_bits[0xb] = 0;
                  local_158.__fds_bits[0xc] = 0;
                  local_158.__fds_bits[0xd] = 0;
                  local_158.__fds_bits[0xe] = 0;
                  local_158.__fds_bits[0xf] = 0;
                  local_1d8.__fds_bits[0] = 0;
                  local_1d8.__fds_bits[1] = 0;
                  local_1d8.__fds_bits[2] = 0;
                  local_1d8.__fds_bits[3] = 0;
                  local_1d8.__fds_bits[4] = 0;
                  local_1d8.__fds_bits[5] = 0;
                  local_1d8.__fds_bits[6] = 0;
                  local_1d8.__fds_bits[7] = 0;
                  local_1d8.__fds_bits[8] = 0;
                  local_1d8.__fds_bits[9] = 0;
                  local_1d8.__fds_bits[10] = 0;
                  local_1d8.__fds_bits[0xb] = 0;
                  local_1d8.__fds_bits[0xc] = 0;
                  local_1d8.__fds_bits[0xd] = 0;
                  local_1d8.__fds_bits[0xe] = 0;
                  local_1d8.__fds_bits[0xf] = 0;
                  local_258.__fds_bits[0xe] = 0;
                  local_258.__fds_bits[0xf] = 0;
                  local_258.__fds_bits[0xc] = 0;
                  local_258.__fds_bits[0xd] = 0;
                  local_258.__fds_bits[10] = 0;
                  local_258.__fds_bits[0xb] = 0;
                  local_258.__fds_bits[8] = 0;
                  local_258.__fds_bits[9] = 0;
                  local_258.__fds_bits[6] = 0;
                  local_258.__fds_bits[7] = 0;
                  local_258.__fds_bits[4] = 0;
                  local_258.__fds_bits[5] = 0;
                  local_258.__fds_bits[2] = 0;
                  local_258.__fds_bits[3] = 0;
                  local_258.__fds_bits[0] = 0;
                  local_258.__fds_bits[1] = 0;
                  local_268.tv_sec = 1;
                  local_268.tv_usec = 0;
                  iVar2 = curl_multi_fdset(lVar6,&local_158,&local_1d8,&local_258,&local_26c);
                  uVar10 = _stderr;
                  if (iVar2 != 0) {
                    uVar4 = curl_multi_strerror(iVar2);
                    pcVar11 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                    uVar9 = 0x62;
                    iVar1 = iVar2;
LAB_001028a0:
                    curl_mfprintf(uVar10,pcVar11,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1502.c"
                                  ,uVar9,iVar1,uVar4);
                    goto LAB_0010246e;
                  }
                  if (local_26c < -1) {
                    pcVar11 = 
                    "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
                    uVar10 = 0x62;
                    goto LAB_0010277d;
                  }
                  iVar2 = select_wrapper(local_26c + 1,&local_158,&local_1d8,&local_258,&local_268);
                  if (iVar2 == -1) {
                    piVar8 = __errno_location();
                    uVar10 = _stderr;
                    iVar1 = *piVar8;
                    pcVar11 = strerror(iVar1);
                    curl_mfprintf(uVar10,"%s:%d select() failed, with errno %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1502.c"
                                  ,0x66,iVar1,pcVar11);
                    iVar1 = 0x79;
                    goto LAB_0010246e;
                  }
                  tVar12 = tutil_tvnow();
                  lVar7 = tutil_tvdiff(tVar12,tv_test_start);
                  if (60000 < lVar7) {
                    uVar10 = 0x68;
                    goto LAB_001027ab;
                  }
                  iVar2 = curl_multi_perform(lVar6,&local_270);
                  uVar10 = _stderr;
                  if (iVar2 != 0) {
                    uVar4 = curl_multi_strerror(iVar2);
                    pcVar11 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
                    uVar9 = 0x6a;
                    iVar1 = iVar2;
                    goto LAB_001028a0;
                  }
                  if (local_270 < 0) {
                    pcVar11 = 
                    "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                    ;
                    uVar10 = 0x6a;
                    goto LAB_0010277d;
                  }
                  tVar12 = tutil_tvnow();
                  lVar7 = tutil_tvdiff(tVar12,tv_test_start);
                } while (lVar7 < 0xea61);
                uVar10 = 0x6c;
              }
              else {
                uVar10 = 0x53;
              }
LAB_001027ab:
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1502.c"
                            ,uVar10);
              iVar1 = 0x7d;
            }
            goto LAB_0010246e;
          }
          uVar4 = curl_multi_strerror(iVar1);
          pcVar11 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
          uVar9 = 0x51;
        }
        else {
          uVar4 = curl_multi_strerror(iVar1);
          pcVar11 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
          uVar9 = 0x4f;
        }
        goto LAB_00102461;
      }
      lVar6 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1502.c"
                    ,0x4d);
      iVar1 = 0x7b;
    }
    else {
      uVar4 = curl_easy_strerror(iVar1);
      pcVar11 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar6 = 0;
      uVar9 = 0x49;
LAB_00102461:
      curl_mfprintf(uVar10,pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1502.c"
                    ,uVar9,iVar1,uVar4);
    }
LAB_0010246e:
    curl_multi_cleanup(lVar6);
    curl_easy_cleanup(lVar5);
    curl_global_cleanup();
  }
  else {
    uVar4 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar10,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib1502.c"
                  ,0x41,iVar1,uVar4);
  }
  curl_slist_free_all(lVar3);
LAB_0010248b:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL* easy = NULL;
  CURLM* multi = NULL;
  int still_running;
  int res = 0;

  char redirect[160];

  /* DNS cache injection */
  struct curl_slist *dns_cache_list;

  snprintf(redirect, sizeof(redirect), "google.com:%s:%s", libtest_arg2,
           libtest_arg3);

  start_test_timing();

  dns_cache_list = curl_slist_append(NULL, redirect);
  if(!dns_cache_list) {
    fprintf(stderr, "curl_slist_append() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    curl_slist_free_all(dns_cache_list);
    return res;
  }

  easy_init(easy);

  easy_setopt(easy, CURLOPT_URL, URL);
  easy_setopt(easy, CURLOPT_HEADER, 1L);
  easy_setopt(easy, CURLOPT_RESOLVE, dns_cache_list);

  multi_init(multi);

  multi_add_handle(multi, easy);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

test_cleanup:

#ifdef LIB1502
  /* undocumented cleanup sequence - type UA */
  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();
#endif

#ifdef LIB1503
  /* proper cleanup sequence - type PA */
  curl_multi_remove_handle(multi, easy);
  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();
#endif

#ifdef LIB1504
  /* undocumented cleanup sequence - type UB */
  curl_easy_cleanup(easy);
  curl_multi_cleanup(multi);
  curl_global_cleanup();
#endif

#ifdef LIB1505
  /* proper cleanup sequence - type PB */
  curl_multi_remove_handle(multi, easy);
  curl_easy_cleanup(easy);
  curl_multi_cleanup(multi);
  curl_global_cleanup();
#endif

  curl_slist_free_all(dns_cache_list);

  return res;
}